

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::FeaturesDebugStringTest> *
__thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>
          (ParameterizedTestSuiteRegistry *this,string *test_suite_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference ppPVar4;
  undefined4 extraout_var;
  TypeId pvVar5;
  char *test_suite_name_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar6;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_b8;
  undefined1 local_b0;
  size_type local_a8;
  undefined1 local_99;
  CodeLocation local_98;
  string local_60;
  value_type local_40;
  ParameterizedTestSuiteInfoBase *test_suite_info;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_30;
  iterator item_it;
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>
  *typed_test_info;
  CodeLocation *code_location_local;
  string *test_suite_name_local;
  ParameterizedTestSuiteRegistry *this_local;
  
  item_it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
             )(__node_type *)0x0;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->suite_name_to_info_index_,test_suite_name);
  test_suite_info =
       (ParameterizedTestSuiteInfoBase *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&this->suite_name_to_info_index_);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      *)&test_suite_info);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                           *)&local_30);
    ppPVar4 = std::
              vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
              ::operator[](&this->test_suite_infos_,ppVar3->second);
    local_40 = *ppPVar4;
    iVar2 = (*local_40->_vptr_ParameterizedTestSuiteInfoBase[3])();
    pvVar5 = GetTypeId<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>();
    if ((TypeId)CONCAT44(extraout_var,iVar2) != pvVar5) {
      test_suite_name_00 = (char *)std::__cxx11::string::c_str();
      ReportInvalidTestSuiteType(test_suite_name_00,code_location);
      posix::Abort();
    }
    item_it.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               )CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>,testing::internal::ParameterizedTestSuiteInfoBase>
                          (local_40);
  }
  if (item_it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_00._M_cur = (__node_type *)operator_new(0x80);
    local_99 = 1;
    std::__cxx11::string::string((string *)&local_60,(string *)test_suite_name);
    CodeLocation::CodeLocation(&local_98,code_location);
    ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>::
    ParameterizedTestSuiteInfo
              ((ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>
                *)this_00._M_cur,&local_60,&local_98);
    local_99 = 0;
    item_it.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                 )this_00._M_cur;
    CodeLocation::~CodeLocation(&local_98);
    std::__cxx11::string::~string((string *)&local_60);
    local_a8 = std::
               vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
               ::size(&this->test_suite_infos_);
    pVar6 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::emplace<std::__cxx11::string,unsigned_long>
                      ((unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)&this->suite_name_to_info_index_,test_suite_name,&local_a8);
    local_b8._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur;
    local_b0 = pVar6.second;
    local_c0 = item_it.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               ._M_cur;
    std::
    vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
    ::push_back(&this->test_suite_infos_,(value_type *)&local_c0);
  }
  return (ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::FeaturesDebugStringTest>
          *)item_it.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur._M_cur;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      std::string test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;

    auto item_it = suite_name_to_info_index_.find(test_suite_name);
    if (item_it != suite_name_to_info_index_.end()) {
      auto* test_suite_info = test_suite_infos_[item_it->second];
      if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
        // Complain about incorrect usage of Google Test facilities
        // and terminate the program since we cannot guaranty correct
        // test suite setup and tear-down in this case.
        ReportInvalidTestSuiteType(test_suite_name.c_str(), code_location);
        posix::Abort();
      } else {
        // At this point we are sure that the object we found is of the same
        // type we are looking for, so we downcast it to that type
        // without further checks.
        typed_test_info =
            CheckedDowncastToActualType<ParameterizedTestSuiteInfo<TestSuite>>(
                test_suite_info);
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, std::move(code_location));
      suite_name_to_info_index_.emplace(std::move(test_suite_name),
                                        test_suite_infos_.size());
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }